

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

double __thiscall
baryonyx::itm::default_cost_type<double>::min(default_cost_type<double> *this,int n)

{
  type pdVar1;
  double *pdVar2;
  unique_ptr<double[],_std::default_delete<double[]>_> *this_00;
  double dVar3;
  double local_30;
  int local_24;
  double dStack_20;
  int i;
  double min;
  default_cost_type<double> *pdStack_10;
  int n_local;
  default_cost_type<double> *this_local;
  
  min._4_4_ = n;
  pdStack_10 = this;
  dStack_20 = std::numeric_limits<double>::max();
  for (local_24 = 0; local_24 != min._4_4_; local_24 = local_24 + 1) {
    pdVar1 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)local_24);
    if ((*pdVar1 != 0.0) || (NAN(*pdVar1))) {
      this_00 = &this->linear_elements;
      pdVar1 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (this_00,(long)local_24);
      dVar3 = *pdVar1;
      std::abs((int)this_00);
      local_30 = dVar3;
      pdVar2 = std::min<double>(&stack0xffffffffffffffe0,&local_30);
      dStack_20 = *pdVar2;
    }
  }
  return dStack_20;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        return min;
    }